

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O0

char * LoadTimeStep(MpiStreamWR Stream,size_t TimeStep)

{
  long in_RSI;
  long in_RDI;
  char *Data;
  TimeStepsEntry Entry;
  char *local_20;
  long *local_18;
  
  local_20 = (char *)0x0;
  pthread_rwlock_rdlock((pthread_rwlock_t *)(in_RDI + 0x40));
  for (local_18 = *(long **)(in_RDI + 0x20); (local_18 != (long *)0x0 && (*local_18 != in_RSI));
      local_18 = (long *)local_18[2]) {
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)(in_RDI + 0x40));
  if ((local_18 != (long *)0x0) && (local_18[1] != 0)) {
    local_20 = *(char **)(local_18[1] + 8);
  }
  return local_20;
}

Assistant:

static char *LoadTimeStep(MpiStreamWR Stream, size_t TimeStep)
{
    TimeStepsEntry Entry = NULL;
    char *Data = NULL;

    pthread_rwlock_rdlock(&Stream->LockTS);
    STAILQ_FOREACH(Entry, &Stream->TimeSteps, entries)
    {
        if (Entry->TimeStep == TimeStep)
        {
            break;
        }
    }
    pthread_rwlock_unlock(&Stream->LockTS);

    if (Entry && Entry->Data)
    {
        Data = Entry->Data->block;
    }

    return Data;
}